

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::unionWith
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this,unsigned_long left,
          unsigned_long right,monostate *value,allocator_type *alloc)

{
  overlap_iterator it;
  overlap_iterator local_60;
  
  local_60.super_iterator.super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
       (pointer)((long)&local_60.super_iterator.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> + 0x18);
  local_60.super_iterator.super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  local_60.super_iterator.super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
  local_60.super_iterator.super_const_iterator.map = this;
  local_60.searchKey.left = left;
  local_60.searchKey.right = right;
  overlap_iterator::unionWith(&local_60,value,alloc);
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
             &local_60.super_iterator.super_const_iterator.path,(EVP_PKEY_CTX *)value);
  return;
}

Assistant:

explicit const_iterator(const IntervalMap& map) : map(const_cast<IntervalMap*>(&map)) {}